

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.hpp
# Opt level: O2

void __thiscall
pstore::broker::
message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
::push(message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
       *this,unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
             *message)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mut_);
  std::
  deque<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>,std::allocator<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>>
  ::
  emplace_back<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>
            ((deque<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>,std::allocator<std::unique_ptr<pstore::brokerface::message_type,std::default_delete<pstore::brokerface::message_type>>>>
              *)&this->queue_,message);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void message_queue<T>::push (T && message) {
            std::unique_lock<decltype (mut_)> lock (mut_);
            queue_.push (std::move (message));
            cv.notify_one ();
        }